

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

int __thiscall QTextEdit::fontWeight(QTextEdit *this)

{
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QWidgetTextControl local_30 [8];
  QTextFormat local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QWidgetTextControl::textCursor(local_30);
  QTextCursor::charFormat();
  cVar1 = QTextFormat::hasProperty((int)local_28);
  iVar2 = 400;
  if (cVar1 != '\0') {
    iVar2 = QTextFormat::intProperty((int)local_28);
  }
  QTextFormat::~QTextFormat(local_28);
  QTextCursor::~QTextCursor((QTextCursor *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QTextEdit::fontWeight() const
{
    Q_D(const QTextEdit);
    return d->control->textCursor().charFormat().fontWeight();
}